

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall TPZMatrix<int>::CompareValues(TPZMatrix<int> *this,TPZMatrix<int> *M,int tol)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int in_EDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var6;
  __type_conflict _Var7;
  int exps;
  int64_t j;
  int64_t i;
  REAL diff;
  int64_t ncols;
  int64_t nrows;
  long local_48;
  long local_40;
  
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(in_RSI);
  if ((iVar5 == iVar3) && (iVar5 = TPZBaseMatrix::Cols(in_RSI), iVar5 == iVar4)) {
    local_40 = 0;
    do {
      if (iVar3 <= local_40) {
        return true;
      }
      for (local_48 = 0; local_48 < iVar4; local_48 = local_48 + 1) {
        iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_40,local_48);
        iVar2 = (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RSI,local_40,local_48);
        _Var6 = std::fabs<int>(iVar1 - iVar2);
        _Var7 = std::fabs<int>(in_EDX);
        if (_Var7 < _Var6) {
          return false;
        }
      }
      local_40 = local_40 + 1;
    } while( true );
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::CompareValues(TPZMatrix<TVar> &M, TVar tol){
	
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if ( (M.Rows() != nrows) || (M.Cols() != ncols) ) return false;
	
	REAL diff;
	for( int64_t i = 0; i < nrows; i++)
		for( int64_t j = 0; j < ncols; j++){
            TVar exps = this->Get(i,j) - M.Get(i,j);
			diff = fabs( exps );
			if (diff > fabs(tol)) return false;
		}
	
	return true;
}